

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O3

int cram_subexp_decode(cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  byte bVar1;
  int iVar2;
  cram_external_type cVar3;
  uchar *puVar4;
  uint uVar5;
  uint uVar6;
  int32_t *out_i;
  uint uVar7;
  cram_external_type cVar8;
  size_t sVar9;
  long lVar10;
  int iVar11;
  cram_external_type cVar12;
  
  iVar2 = *out_size;
  if (0 < (long)iVar2) {
    cVar3 = (c->field_6).external.type;
    puVar4 = in->data;
    sVar9 = in->byte;
    lVar10 = 0;
    do {
      cVar8 = E_LONG;
      uVar6 = in->bit;
      do {
        bVar1 = puVar4[sVar9];
        uVar7 = uVar6 - 1;
        in->bit = uVar7;
        if (uVar6 == 0) {
          in->bit = 7;
          sVar9 = sVar9 + 1;
          in->byte = sVar9;
          uVar7 = 7;
        }
        cVar8 = cVar8 - E_INT;
        uVar5 = uVar6 & 0x1f;
        uVar6 = uVar7;
      } while ((bVar1 >> uVar5 & 1) != 0);
      if (cVar8 == E_INT) {
        iVar11 = 0;
        for (cVar8 = cVar3; cVar8 != 0; cVar8 = cVar8 - E_INT) {
          iVar11 = (uint)((puVar4[sVar9] >> (uVar7 & 0x1f) & 1) != 0) + iVar11 * 2;
          sVar9 = sVar9 + ((int)uVar7 < 1);
          in->byte = sVar9;
          uVar7 = uVar7 - 1 & 7;
          in->bit = uVar7;
        }
      }
      else {
        iVar11 = 0;
        if (cVar3 - cVar8 != 0) {
          iVar11 = 0;
          cVar12 = cVar3;
          do {
            iVar11 = (uint)((puVar4[sVar9] >> (uVar7 & 0x1f) & 1) != 0) + iVar11 * 2;
            sVar9 = sVar9 + ((int)uVar7 < 1);
            in->byte = sVar9;
            uVar7 = uVar7 - 1 & 7;
            in->bit = uVar7;
            cVar12 = cVar12 - E_INT;
          } while (cVar8 != cVar12);
        }
        iVar11 = (1 << ((byte)(cVar3 - cVar8) & 0x1f)) + iVar11;
      }
      *(int *)(out + lVar10 * 4) = iVar11 - (c->field_6).huffman.ncodes;
      lVar10 = lVar10 + 1;
    } while (lVar10 != iVar2);
  }
  return 0;
}

Assistant:

int cram_subexp_decode(cram_slice *slice, cram_codec *c, cram_block *in, char *out, int *out_size) {
    int32_t *out_i = (int32_t *)out;
    int n, count;
    int k = c->subexp.k;

    for (count = 0, n = *out_size; count < n; count++) {
	int i = 0, tail;
	int val;

	/* Get number of 1s */
	//while (get_bit_MSB(in) == 1) i++;
	i = get_one_bits_MSB(in);

	/*
	 * Val is
	 * i > 0:  2^(k+i-1) + k+i-1 bits
	 * i = 0:  k bits
	 */
	if (i) {
	    tail = i + k-1;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	    val += 1 << (i + k-1);
	} else {
	    tail = k;
	    val = 0;
	    while (tail) {
		//val = val<<1; val |= get_bit_MSB(in);
		GET_BIT_MSB(in, val);
		tail--;
	    }
	}

	out_i[count] = val - c->subexp.offset;
    }

    return 0;
}